

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAnnotationObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFAnnotationObjectHelper::getAppearanceState_abi_cxx11_
          (string *__return_storage_ptr__,QPDFAnnotationObjectHelper *this)

{
  bool bVar1;
  allocator<char> local_b2;
  allocator<char> local_b1;
  string local_b0 [32];
  QPDFObjectHelper local_90;
  allocator<char> local_59;
  string local_58 [32];
  QPDFObjectHelper local_38;
  QPDFAnnotationObjectHelper *this_local;
  
  local_38.oh_.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  this_local = (QPDFAnnotationObjectHelper *)__return_storage_ptr__;
  QPDFObjectHelper::oh(&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/AS",&local_59);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)
             &local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)&local_38);
  bVar1 = QPDFObjectHandle::isName
                    ((QPDFObjectHandle *)
                     &local_38.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_38);
  if (bVar1) {
    QTC::TC("qpdf","QPDFAnnotationObjectHelper AS present",0);
    QPDFObjectHelper::oh(&local_90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b0,"/AS",&local_b1);
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)
               &local_90.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (string *)&local_90);
    QPDFObjectHandle::getName_abi_cxx11_
              (__return_storage_ptr__,
               (QPDFObjectHandle *)
               &local_90.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &local_90.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_b1);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_90);
  }
  else {
    QTC::TC("qpdf","QPDFAnnotationObjectHelper AS absent",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_b2);
    std::allocator<char>::~allocator(&local_b2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFAnnotationObjectHelper::getAppearanceState()
{
    if (oh().getKey("/AS").isName()) {
        QTC::TC("qpdf", "QPDFAnnotationObjectHelper AS present");
        return oh().getKey("/AS").getName();
    }
    QTC::TC("qpdf", "QPDFAnnotationObjectHelper AS absent");
    return "";
}